

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O3

FT_Error cff_size_request(FT_Size size,FT_Size_Request req)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_ULong FVar3;
  long b_;
  long c_;
  int iVar4;
  FT_Module pFVar5;
  FT_Long a_;
  FT_Long FVar6;
  FT_Face face;
  PSHinter_Service pshinter;
  ulong uVar7;
  FT_ULong local_50;
  FT_ULong strike_index;
  undefined8 *local_40;
  long local_38;
  
  face = size->face;
  if ((face->face_flags & 2) != 0) {
    iVar4 = (**(code **)(*(long *)&face[3].units_per_EM + 0xd0))(face,req,&local_50);
    if (iVar4 == 0) {
      cff_size_select(size,local_50);
      return 0;
    }
    size[1].face = (FT_Face)0xffffffff;
    face = size->face;
  }
  FT_Request_Metrics(face,req);
  puVar1 = *(undefined8 **)(size->face[4].bbox.yMin + 0x1358);
  pFVar5 = FT_Get_Module((size->face->driver->root).library,"pshinter");
  if ((((pFVar5 != (FT_Module)0x0) && (puVar1 != (undefined8 *)0x0)) &&
      (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) &&
     (local_38 = (*pcVar2)(pFVar5), local_38 != 0)) {
    FVar3 = size->face[4].bbox.yMin;
    local_40 = (undefined8 *)size->internal->module_data;
    b_ = *(long *)(FVar3 + 0x6d0);
    (**(code **)(local_38 + 8))(*local_40,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
    strike_index = FVar3;
    for (uVar7 = (ulong)*(uint *)(FVar3 + 0xb30); uVar7 != 0; uVar7 = uVar7 - 1) {
      c_ = *(long *)(*(long *)(strike_index + 0xb30 + uVar7 * 8) + 0x68);
      a_ = (size->metrics).x_scale;
      if (b_ == c_) {
        FVar6 = (size->metrics).y_scale;
      }
      else {
        a_ = FT_MulDiv(a_,b_,c_);
        FVar6 = FT_MulDiv((size->metrics).y_scale,b_,c_);
      }
      (**(code **)(local_38 + 8))(local_40[uVar7],a_,FVar6,0,0);
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      CFF_Face      cffface = (CFF_Face)size->face;
      SFNT_Service  sfnt    = (SFNT_Service)cffface->sfnt;
      FT_ULong      strike_index;


      if ( sfnt->set_sbit_strike( cffface, req, &strike_index ) )
        cffsize->strike_index = 0xFFFFFFFFUL;
      else
        return cff_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    FT_Request_Metrics( size->face, req );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      cffface  = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)cffface->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }